

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64_shift.hpp
# Opt level: O2

double trng::lcg64_shift::pow(double __x,double __y)

{
  ulong in_RSI;
  
  for (; in_RSI != 0; in_RSI = in_RSI >> 1) {
  }
  return __x;
}

Assistant:

TRNG_CUDA_ENABLE
  inline lcg64_shift::result_type lcg64_shift::pow(lcg64_shift::result_type x,
                                                   lcg64_shift::result_type n) {
    lcg64_shift::result_type result{1};
    while (n > 0) {
      if ((n & 1u) > 0)
        result *= x;
      x *= x;
      n >>= 1u;
    }
    return result;
  }